

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O2

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnFunctionSymbol
          (BinaryReaderIR *this,Index index,uint32_t flags,string_view name,Index func_index)

{
  Module *pMVar1;
  Func *pFVar2;
  string *orig_name;
  string dollar_name;
  string_view in_stack_ffffffffffffff88;
  __buckets_ptr local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  float local_38;
  
  orig_name = (string *)name.data_;
  if (name.size_ != 0) {
    pMVar1 = this->module_;
    pFVar2 = (pMVar1->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl
             .super__Vector_impl_data._M_start[func_index];
    if ((pFVar2->name)._M_string_length == 0) {
      (anonymous_namespace)::MakeDollarName_abi_cxx11_(in_stack_ffffffffffffff88);
      GetUniqueName((string *)&stack0xffffffffffffff88,(BinaryReaderIR *)&pMVar1->func_bindings,
                    (BindingHash *)&local_58,orig_name);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_assign((string *)pFVar2);
      uStack_48 = 0;
      uStack_44 = 0;
      local_58 = (__buckets_ptr)0x0;
      uStack_50 = 0;
      uStack_4c = 0;
      local_38 = (float)func_index;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
      ::_M_emplace<std::__cxx11::string&,wabt::Binding>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::Binding>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                  *)&this->module_->func_bindings,&stack0xffffffffffffff88,&local_58);
      std::__cxx11::string::_M_dispose();
    }
  }
  return (Result)Ok;
}

Assistant:

constexpr inline bool string_view::empty() const noexcept {
  return size_ == 0;
}